

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsObjectDeleteProperty
          (JsValueRef object,JsValueRef propertyId,bool useStrictRules,JsValueRef *result)

{
  anon_class_32_4_3f44d12c fn;
  JsErrorCode JVar1;
  JsValueRef *local_28;
  JsValueRef *result_local;
  JsValueRef pvStack_18;
  bool useStrictRules_local;
  JsValueRef propertyId_local;
  JsValueRef object_local;
  
  fn.propertyId = &local_28;
  fn.object = &stack0xffffffffffffffe8;
  fn.result = (JsValueRef **)((long)&result_local + 7);
  fn.useStrictRules = (bool *)&propertyId_local;
  local_28 = result;
  result_local._7_1_ = useStrictRules;
  pvStack_18 = propertyId;
  propertyId_local = object;
  JVar1 = ContextAPIWrapper<false,JsObjectDeleteProperty::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsObjectDeleteProperty(_In_ JsValueRef object, _In_ JsValueRef propertyId,
    _In_ bool useStrictRules, _Out_ JsValueRef *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_RECYCLABLE(propertyId, scriptContext);
        PARAM_NOT_NULL(result);
        *result = nullptr;

        const Js::PropertyRecord *propertyRecord = nullptr;
        JsErrorCode errorValue = InternalGetPropertyRecord(scriptContext,
            Js::VarTo<Js::RecyclableObject>(propertyId), &propertyRecord);

        if (errorValue != JsNoError)
        {
            return errorValue;
        }

        Assert(propertyRecord != nullptr);

        return JsDeletePropertyCommon(scriptContext, object, propertyRecord,
            useStrictRules, result);
    });
}